

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

void __thiscall
ContextSpecificHolder<BitString,_(unsigned_char)'\xa3',_(OptionType)0>::Encode
          (ContextSpecificHolder<BitString,_(unsigned_char)__xa3_,_(OptionType)0> *this,uchar *pOut,
          size_t cbOut,size_t *cbUsed)

{
  size_t size;
  size_t sVar1;
  out_of_range *this_00;
  size_t cbSize;
  size_t innerSize;
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *pOut_local;
  ContextSpecificHolder<BitString,_(unsigned_char)__xa3_,_(OptionType)0> *this_local;
  
  size = DerBase::EncodedSize((DerBase *)this);
  if (size < 3) {
    *cbUsed = 0;
  }
  else {
    sVar1 = GetSizeBytes(size);
    if (cbOut < sVar1 + 1 + size) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Insufficient buffer");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    BitString::Encode(&this->innerType,pOut,cbOut,cbUsed);
    *pOut = 0xa3;
  }
  return;
}

Assistant:

void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed)
    {
        // Handle the case where there is no data, and we shouldn't write out anything
        size_t innerSize = innerType.EncodedSize();

        if (innerSize <= 2)
        {
            cbUsed = 0;
            return;
        }

        size_t cbSize = GetSizeBytes(innerSize);

        if (1 + cbSize + innerSize > cbOut)
        {
            throw std::out_of_range("Insufficient buffer");
        }

        // A non-constructed type is the same as the type it wraps, 
        // except for the type byte, which will be ([0x80 or 0xA0] | option number)
        innerType.Encode(pOut, cbOut, cbUsed);
        *pOut = static_cast<unsigned char>(type);
    }